

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
* __thiscall
bhf::ads::SymbolEntry::Parse_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
           *__return_storage_ptr__,SymbolEntry *this,uint8_t *data,size_t lengthLimit)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
  *this_00;
  ostream *poVar1;
  AdsException *pAVar2;
  ulong uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  string local_260;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
  *local_240;
  undefined1 local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  stringstream stream;
  ostream local_1a8 [376];
  
  if (data < (uint8_t *)0x1e) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar1 = std::operator<<(local_1a8,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Read data to short to contain symbol info: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)local_238);
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar2,0x706);
    __cxa_throw(pAVar2,&AdsException::typeinfo,AdsException::~AdsException);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d8._M_p = (pointer)&local_1c8;
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  puVar4 = (uint8_t *)(ulong)(this->header).entryLength;
  local_238._0_8_ = *(undefined8 *)&this->header;
  local_238._8_4_ = (this->header).iOffs;
  local_238._12_4_ = (this->header).size;
  local_238._16_4_ = (this->header).dataType;
  local_238._20_4_ = (this->header).flags;
  local_238._24_2_ = (this->header).nameLength;
  local_238._26_2_ = (this->header).typeLength;
  local_238._28_2_ = (this->header).commentLength;
  if (data < puVar4) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar1 = std::operator<<(local_1a8,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Corrupt entry length: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar2,0x706);
  }
  else if (puVar4 + -0x1f < (uint8_t *)(ulong)(ushort)local_238._24_2_) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar1 = std::operator<<(local_1a8,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Corrupt nameLength: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_238._24_2_);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar2,0x706);
  }
  else {
    puVar6 = &this->field_0x1e;
    local_240 = __return_storage_ptr__;
    _stream = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stream,puVar6,(uint8_t *)(ulong)(ushort)local_238._24_2_ + (long)puVar6);
    std::__cxx11::string::operator=((string *)&local_218,(string *)&stream);
    std::__cxx11::string::~string((string *)&stream);
    uVar5 = ~(ulong)(ushort)local_238._24_2_;
    if (puVar4 + (uVar5 - 0x1f) < (uint8_t *)(ulong)(ushort)local_238._26_2_) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      poVar1 = std::operator<<(local_1a8,"Parse");
      poVar1 = std::operator<<(poVar1,"(): Corrupt typeLength: ");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_238._26_2_);
      std::operator<<(poVar1,'\n');
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
      AdsException::AdsException(pAVar2,0x706);
    }
    else {
      puVar6 = puVar6 + (ulong)(ushort)local_238._24_2_ + 1;
      _stream = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stream,puVar6,(uint8_t *)(ulong)(ushort)local_238._26_2_ + (long)puVar6)
      ;
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)&stream);
      std::__cxx11::string::~string((string *)&stream);
      uVar3 = (ulong)(ushort)local_238._26_2_;
      if ((uint8_t *)(ulong)(ushort)local_238._28_2_ <= puVar4 + (uVar5 - uVar3) + -0x20) {
        _stream = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stream,puVar6 + uVar3 + 1,
                   puVar6 + (long)((uint8_t *)(ulong)(ushort)local_238._28_2_ + uVar3 + 1));
        this_00 = local_240;
        std::__cxx11::string::operator=((string *)&local_1d8,(string *)&stream);
        std::__cxx11::string::~string((string *)&stream);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::ads::SymbolEntry_&,_true>
                  (this_00,&local_218,(SymbolEntry *)local_238);
        ~SymbolEntry((SymbolEntry *)local_238);
        return this_00;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      poVar1 = std::operator<<(local_1a8,"Parse");
      poVar1 = std::operator<<(poVar1,"(): Corrupt commentLength: ");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_238._28_2_);
      std::operator<<(poVar1,'\n');
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      pAVar2 = (AdsException *)__cxa_allocate_exception(0x30);
      AdsException::AdsException(pAVar2,0x706);
    }
  }
  __cxa_throw(pAVar2,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

std::pair<std::string, SymbolEntry> SymbolEntry::Parse(const uint8_t* data, size_t lengthLimit)
{
    const auto pHeader = reinterpret_cast<const AdsSymbolEntry*>(data);
    if (sizeof(*pHeader) > lengthLimit) {
        LOG_ERROR(__FUNCTION__ << "(): Read data to short to contain symbol info: " << std::dec << lengthLimit << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    SymbolEntry entry;
    entry.header.entryLength = letoh(pHeader->entryLength);
    entry.header.iGroup = letoh(pHeader->iGroup);
    entry.header.iOffs = letoh(pHeader->iOffs);
    entry.header.size = letoh(pHeader->size);
    entry.header.dataType = letoh(pHeader->dataType);
    entry.header.flags = letoh(pHeader->flags);
    entry.header.nameLength = letoh(pHeader->nameLength);
    entry.header.typeLength = letoh(pHeader->typeLength);
    entry.header.commentLength = letoh(pHeader->commentLength);

    if (entry.header.entryLength > lengthLimit) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt entry length: " << std::dec << entry.header.entryLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    lengthLimit = entry.header.entryLength - sizeof(entry.header);
    data += sizeof(entry.header);

    if (entry.header.nameLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt nameLength: " << std::dec << entry.header.nameLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.name = std::string(reinterpret_cast<const char*>(data), entry.header.nameLength);
    lengthLimit -= entry.header.nameLength + 1;
    data += entry.header.nameLength + 1;

    if (entry.header.typeLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt typeLength: " << std::dec << entry.header.typeLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.typeName = std::string(reinterpret_cast<const char*>(data), entry.header.typeLength);
    lengthLimit -= entry.header.typeLength + 1;
    data += entry.header.typeLength + 1;

    if (entry.header.commentLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt commentLength: " << std::dec << entry.header.commentLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.comment = std::string(reinterpret_cast<const char*>(data), entry.header.commentLength);
    return {entry.name, entry};
}